

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# var_based_part.c
# Opt level: O0

void set_low_temp_var_flag
               (AV1_COMP *cpi,PartitionSearchInfo *part_info,MACROBLOCKD *xd,VP128x128 *vt,
               int64_t *thresholds,MV_REFERENCE_FRAME ref_frame_partition,int mi_col,int mi_row,
               _Bool is_small_sb)

{
  VP128x128 *in_RCX;
  MACROBLOCKD *in_RDX;
  PartitionSearchInfo *in_RSI;
  long in_RDI;
  int64_t *in_R8;
  char in_R9B;
  int in_stack_00000008;
  int in_stack_00000010;
  byte in_stack_00000018;
  AV1_COMMON *cm;
  
  if (in_R9B == '\x01') {
    if ((in_stack_00000018 & 1) == 0) {
      set_low_temp_var_flag_128x128
                ((CommonModeInfoParams *)(in_RDI + 0x3c188),in_RSI,in_RDX,in_RCX,in_R8,
                 in_stack_00000008,in_stack_00000010);
    }
    else {
      set_low_temp_var_flag_64x64
                ((CommonModeInfoParams *)(in_RDI + 0x3c188),in_RSI,in_RDX,in_RCX->split,in_R8,
                 in_stack_00000008,in_stack_00000010);
    }
  }
  return;
}

Assistant:

static inline void set_low_temp_var_flag(
    AV1_COMP *cpi, PartitionSearchInfo *part_info, MACROBLOCKD *xd,
    VP128x128 *vt, int64_t thresholds[], MV_REFERENCE_FRAME ref_frame_partition,
    int mi_col, int mi_row, const bool is_small_sb) {
  AV1_COMMON *const cm = &cpi->common;
  // Check temporal variance for bsize >= 16x16, if LAST_FRAME was selected.
  // If the temporal variance is small set the flag
  // variance_low for the block. The variance threshold can be adjusted, the
  // higher the more aggressive.
  if (ref_frame_partition == LAST_FRAME) {
    if (is_small_sb)
      set_low_temp_var_flag_64x64(&cm->mi_params, part_info, xd,
                                  &(vt->split[0]), thresholds, mi_col, mi_row);
    else
      set_low_temp_var_flag_128x128(&cm->mi_params, part_info, xd, vt,
                                    thresholds, mi_col, mi_row);
  }
}